

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O2

TapScriptFromStringRequestStruct * __thiscall
cfd::js::api::json::TapScriptFromStringRequest::ConvertToStruct
          (TapScriptFromStringRequestStruct *__return_storage_ptr__,TapScriptFromStringRequest *this
          )

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  
  TapScriptFromStringRequestStruct::TapScriptFromStringRequestStruct(__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  __return_storage_ptr__->is_elements = this->is_elements_;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->tree_string);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->tapscript);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->internal_pubkey);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->internal_privkey);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ConvertToStruct(&local_30,&this->nodes_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&__return_storage_ptr__->nodes,&local_30);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_30);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

TapScriptFromStringRequestStruct TapScriptFromStringRequest::ConvertToStruct() const {  // NOLINT
  TapScriptFromStringRequestStruct result;
  result.network = network_;
  result.is_elements = is_elements_;
  result.tree_string = tree_string_;
  result.tapscript = tapscript_;
  result.internal_pubkey = internal_pubkey_;
  result.internal_privkey = internal_privkey_;
  result.nodes = nodes_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}